

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O2

pair<aeron::ImageList_*,_int> __thiscall
aeron::Subscription::removeImage(Subscription *this,int64_t correlationId)

{
  __pointer_type pIVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong *puVar4;
  __pointer_type pIVar5;
  ulong uVar6;
  ulong uVar7;
  Image *pIVar8;
  int j;
  int iVar9;
  ulong uVar10;
  Image *this_00;
  Image *image;
  int i;
  long lVar11;
  ulong uVar12;
  pair<aeron::ImageList_*,_int> pVar13;
  
  pIVar1 = (this->m_imageList)._M_b._M_p;
  uVar12 = pIVar1->m_length;
  uVar7 = 0;
  if (0 < (int)uVar12) {
    uVar7 = uVar12 & 0xffffffff;
  }
  image = pIVar1->m_images;
  uVar3 = 0xffffffffffffffff;
  uVar6 = 0;
  pIVar8 = image;
  while( true ) {
    pIVar5 = (__pointer_type)0x0;
    if (uVar7 == uVar6) goto LAB_00150156;
    if (pIVar8->m_correlationId == correlationId) break;
    uVar6 = uVar6 + 1;
    pIVar8 = pIVar8 + 1;
  }
  lVar11 = (uVar12 << 0x20) + -0x100000000;
  uVar10 = lVar11 >> 0x20;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  uVar3 = SUB168(auVar2 * ZEXT816(0x128),0);
  uVar12 = uVar3 + 8;
  if (0xfffffffffffffff7 < uVar3) {
    uVar12 = 0xffffffffffffffff;
  }
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x128),8) == 0) {
    uVar3 = uVar12;
  }
  Image::close(pIVar8,(int)correlationId);
  puVar4 = (ulong *)operator_new__(uVar3);
  *puVar4 = uVar10;
  pIVar8 = (Image *)(puVar4 + 1);
  if (lVar11 != 0) {
    lVar11 = 0;
    this_00 = pIVar8;
    do {
      Image::Image(this_00);
      lVar11 = lVar11 + -0x128;
      this_00 = this_00 + 1;
    } while (uVar10 * -0x128 - lVar11 != 0);
  }
  iVar9 = 0;
  for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
    if (uVar6 != uVar12) {
      lVar11 = (long)iVar9;
      iVar9 = iVar9 + 1;
      Image::operator=(pIVar8 + lVar11,image);
    }
    image = image + 1;
  }
  pIVar5 = (__pointer_type)operator_new(0x10);
  pIVar5->m_images = pIVar8;
  pIVar5->m_length = uVar10;
  (this->m_imageList)._M_b._M_p = pIVar5;
  uVar3 = uVar6 & 0xffffffff;
  pIVar5 = pIVar1;
LAB_00150156:
  pVar13._8_8_ = uVar3;
  pVar13.first = pIVar5;
  return pVar13;
}

Assistant:

std::pair<struct ImageList *, int> removeImage(std::int64_t correlationId)
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image * oldArray = oldImageList->m_images;
        auto length = static_cast<int>(oldImageList->m_length);
        int index = -1;

        for (int i = 0; i < length; i++)
        {
            if (oldArray[i].correlationId() == correlationId)
            {
                oldArray[i].close();
                index = i;
                break;
            }
        }

        if (-1 != index)
        {
            auto newArray = new Image[length - 1];

            for (int i = 0, j = 0; i < length; i++)
            {
                if (i != index)
                {
                    newArray[j++] = oldArray[i];
                }
            }

            auto newImageList = new struct ImageList(newArray, length - 1);

            std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);
        }

        return std::pair<struct ImageList *, int>(
                (-1 != index) ? oldImageList : nullptr,
                index);
    }